

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O1

_Bool ssh2_connection_need_antispoof_prompt(ssh2_connection_state *s)

{
  Seat *pSVar1;
  _Bool _Var2;
  _Bool _Var3;
  
  pSVar1 = (s->ppl).seat;
  _Var3 = false;
  (*pSVar1->vt->set_trust_status)(pSVar1,false);
  pSVar1 = (s->ppl).seat;
  _Var2 = (*pSVar1->vt->has_mixed_input_stream)(pSVar1);
  if (_Var2) {
    pSVar1 = (s->ppl).seat;
    _Var2 = (*pSVar1->vt->can_set_trust_status)(pSVar1);
    if (_Var2) {
      _Var3 = false;
    }
    else {
      _Var3 = ssh_is_bare((s->ppl).ssh);
      _Var3 = !_Var3;
    }
  }
  return _Var3;
}

Assistant:

bool ssh2_connection_need_antispoof_prompt(struct ssh2_connection_state *s)
{
    seat_set_trust_status(s->ppl.seat, false);
    if (!seat_has_mixed_input_stream(s->ppl.seat))
        return false;
    if (seat_can_set_trust_status(s->ppl.seat))
        return false;
    if (ssh_is_bare(s->ppl.ssh))
        return false;
    return true;
}